

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

json __thiscall server_task_result_metrics::to_json_abi_cxx11_(server_task_result_metrics *this)

{
  json_value extraout_RDX;
  undefined8 in_RDI;
  json jVar1;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff448;
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffff450;
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffff460;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  in_stack_fffffffffffff468;
  value_t in_stack_fffffffffffff54e;
  undefined1 in_stack_fffffffffffff54f;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff550;
  initializer_list_t in_stack_fffffffffffff558;
  undefined1 **local_8d8;
  undefined1 **local_8c0;
  undefined1 **local_8a8;
  undefined1 **local_890;
  undefined1 **local_878;
  undefined1 **local_860;
  undefined1 **local_848;
  undefined1 **local_830;
  undefined1 **local_818;
  undefined1 **local_800;
  undefined1 **local_7e8;
  undefined1 **local_7d0;
  undefined1 **local_7b8;
  undefined1 **local_7a0;
  undefined1 **local_788;
  undefined1 **local_770;
  undefined1 **local_758;
  undefined1 **local_740;
  undefined1 *local_690 [6];
  undefined8 *local_660;
  undefined8 local_658;
  undefined8 *local_650;
  undefined1 *local_648 [3];
  undefined1 local_630 [24];
  undefined8 *local_618;
  undefined8 local_610;
  undefined8 *local_608;
  undefined1 *local_600 [3];
  undefined1 local_5e8 [24];
  undefined8 *local_5d0;
  undefined8 local_5c8;
  undefined8 *local_5c0;
  undefined1 *local_5b8 [3];
  undefined1 local_5a0 [24];
  undefined8 *local_588;
  undefined8 local_580;
  undefined8 *local_578;
  undefined1 *local_570 [3];
  undefined1 local_558 [24];
  undefined8 *local_540;
  undefined8 local_538;
  undefined8 *local_530;
  undefined1 *local_528 [3];
  undefined1 local_510 [24];
  undefined8 *local_4f8;
  undefined8 local_4f0;
  undefined8 *local_4e8;
  undefined1 *local_4e0 [3];
  undefined1 local_4c8 [24];
  undefined8 *local_4b0;
  undefined8 local_4a8;
  undefined8 *local_4a0;
  undefined1 *local_498 [3];
  undefined1 local_480 [24];
  undefined8 *local_468;
  undefined8 local_460;
  undefined8 *local_458;
  undefined1 *local_450 [3];
  undefined1 local_438 [24];
  undefined8 *local_420;
  undefined8 local_418;
  undefined8 *local_410;
  undefined1 *local_408 [3];
  undefined1 local_3f0 [24];
  undefined8 *local_3d8;
  undefined8 local_3d0;
  undefined8 *local_3c8;
  undefined1 *local_3c0 [3];
  undefined1 local_3a8 [24];
  undefined8 *local_390;
  undefined8 local_388;
  undefined8 *local_380;
  undefined1 *local_378 [3];
  undefined1 local_360 [24];
  undefined8 *local_348;
  undefined8 local_340;
  undefined8 *local_338;
  undefined1 *local_330 [3];
  undefined1 local_318 [24];
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 *local_2f0;
  undefined1 *local_2e8 [3];
  undefined1 local_2d0 [24];
  undefined8 *local_2b8;
  undefined8 local_2b0;
  undefined8 *local_2a8;
  undefined1 *local_2a0 [3];
  undefined1 local_288 [24];
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 *local_260;
  undefined1 *local_258 [3];
  undefined1 local_240 [24];
  undefined8 *local_228;
  undefined8 local_220;
  undefined8 *local_208;
  undefined1 *local_200 [3];
  undefined1 local_1e8 [24];
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 *local_1c0;
  undefined1 *local_1b8 [3];
  undefined1 local_1a0 [24];
  undefined1 local_188 [24];
  undefined1 local_170 [24];
  undefined1 local_158 [24];
  undefined1 local_140 [24];
  undefined1 local_128 [24];
  undefined1 local_110 [24];
  undefined1 local_f8 [24];
  undefined1 local_e0 [24];
  undefined1 local_c8 [24];
  undefined1 local_b0 [24];
  undefined1 local_98 [24];
  undefined1 local_80 [24];
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  undefined1 local_38 [24];
  undefined8 *local_20;
  undefined8 local_18;
  
  local_1c0 = local_1b8;
  local_208 = local_200;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[5],_0>
            (in_stack_fffffffffffff450,(char (*) [5])in_stack_fffffffffffff448);
  local_208 = (undefined8 *)local_1e8;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<int_&,_0>(in_stack_fffffffffffff450,(int *)in_stack_fffffffffffff448);
  local_1d0 = local_200;
  local_1c8 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_1a0;
  local_260 = local_258;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[11],_0>
            (in_stack_fffffffffffff450,(char (*) [11])in_stack_fffffffffffff448);
  local_260 = (undefined8 *)local_240;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<int_&,_0>(in_stack_fffffffffffff450,(int *)in_stack_fffffffffffff448);
  local_228 = local_258;
  local_220 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_188;
  local_2a8 = local_2a0;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[9],_0>
            (in_stack_fffffffffffff450,(char (*) [9])in_stack_fffffffffffff448);
  local_2a8 = (undefined8 *)local_288;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<int_&,_0>(in_stack_fffffffffffff450,(int *)in_stack_fffffffffffff448);
  local_270 = local_2a0;
  local_268 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_170;
  local_2f0 = local_2e8;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[8],_0>
            (in_stack_fffffffffffff450,(char (*) [8])in_stack_fffffffffffff448);
  local_2f0 = (undefined8 *)local_2d0;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<long_&,_0>(in_stack_fffffffffffff450,(long *)in_stack_fffffffffffff448);
  local_2b8 = local_2e8;
  local_2b0 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_158;
  local_338 = local_330;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[32],_0>
            (in_stack_fffffffffffff450,(char (*) [32])in_stack_fffffffffffff448);
  local_338 = (undefined8 *)local_318;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<unsigned_long_&,_0>
            (in_stack_fffffffffffff450,(unsigned_long *)in_stack_fffffffffffff448);
  local_300 = local_330;
  local_2f8 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_140;
  local_380 = local_378;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[26],_0>
            (in_stack_fffffffffffff450,(char (*) [26])in_stack_fffffffffffff448);
  local_380 = (undefined8 *)local_360;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<unsigned_long_&,_0>
            (in_stack_fffffffffffff450,(unsigned_long *)in_stack_fffffffffffff448);
  local_348 = local_378;
  local_340 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_128;
  local_3c8 = local_3c0;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[25],_0>
            (in_stack_fffffffffffff450,(char (*) [25])in_stack_fffffffffffff448);
  local_3c8 = (undefined8 *)local_3a8;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<unsigned_long_&,_0>
            (in_stack_fffffffffffff450,(unsigned_long *)in_stack_fffffffffffff448);
  local_390 = local_3c0;
  local_388 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_110;
  local_410 = local_408;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[26],_0>
            (in_stack_fffffffffffff450,(char (*) [26])in_stack_fffffffffffff448);
  local_410 = (undefined8 *)local_3f0;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<unsigned_long_&,_0>
            (in_stack_fffffffffffff450,(unsigned_long *)in_stack_fffffffffffff448);
  local_3d8 = local_408;
  local_3d0 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_f8;
  local_458 = local_450;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[26],_0>
            (in_stack_fffffffffffff450,(char (*) [26])in_stack_fffffffffffff448);
  local_458 = (undefined8 *)local_438;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<unsigned_long_&,_0>
            (in_stack_fffffffffffff450,(unsigned_long *)in_stack_fffffffffffff448);
  local_420 = local_450;
  local_418 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_e0;
  local_4a0 = local_498;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[20],_0>
            (in_stack_fffffffffffff450,(char (*) [20])in_stack_fffffffffffff448);
  local_4a0 = (undefined8 *)local_480;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<unsigned_long_&,_0>
            (in_stack_fffffffffffff450,(unsigned_long *)in_stack_fffffffffffff448);
  local_468 = local_498;
  local_460 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_c8;
  local_4e8 = local_4e0;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[19],_0>
            (in_stack_fffffffffffff450,(char (*) [19])in_stack_fffffffffffff448);
  local_4e8 = (undefined8 *)local_4c8;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<unsigned_long_&,_0>
            (in_stack_fffffffffffff450,(unsigned_long *)in_stack_fffffffffffff448);
  local_4b0 = local_4e0;
  local_4a8 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_b0;
  local_530 = local_528;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[20],_0>
            (in_stack_fffffffffffff450,(char (*) [20])in_stack_fffffffffffff448);
  local_530 = (undefined8 *)local_510;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<unsigned_long_&,_0>
            (in_stack_fffffffffffff450,(unsigned_long *)in_stack_fffffffffffff448);
  local_4f8 = local_528;
  local_4f0 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_98;
  local_578 = local_570;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[15],_0>
            (in_stack_fffffffffffff450,(char (*) [15])in_stack_fffffffffffff448);
  local_578 = (undefined8 *)local_558;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<unsigned_long_&,_0>
            (in_stack_fffffffffffff450,(unsigned_long *)in_stack_fffffffffffff448);
  local_540 = local_570;
  local_538 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_80;
  local_5c0 = local_5b8;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[19],_0>
            (in_stack_fffffffffffff450,(char (*) [19])in_stack_fffffffffffff448);
  local_5c0 = (undefined8 *)local_5a0;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<unsigned_long_&,_0>
            (in_stack_fffffffffffff450,(unsigned_long *)in_stack_fffffffffffff448);
  local_588 = local_5b8;
  local_580 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_68;
  local_608 = local_600;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[22],_0>
            (in_stack_fffffffffffff450,(char (*) [22])in_stack_fffffffffffff448);
  local_608 = (undefined8 *)local_5e8;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<int_&,_0>(in_stack_fffffffffffff450,(int *)in_stack_fffffffffffff448);
  local_5d0 = local_600;
  local_5c8 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_50;
  local_650 = local_648;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[20],_0>
            (in_stack_fffffffffffff450,(char (*) [20])in_stack_fffffffffffff448);
  local_650 = (undefined8 *)local_630;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<int_&,_0>(in_stack_fffffffffffff450,(int *)in_stack_fffffffffffff448);
  local_618 = local_648;
  local_610 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_1c0 = (undefined8 *)local_38;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[6],_0>
            (in_stack_fffffffffffff450,(char (*) [6])in_stack_fffffffffffff448);
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_0>
            (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  local_660 = local_690;
  local_658 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  local_20 = local_1b8;
  local_18 = 0x11;
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(in_stack_fffffffffffff550,in_stack_fffffffffffff558,(bool)in_stack_fffffffffffff54f,
               in_stack_fffffffffffff54e);
  local_740 = (undefined1 **)&local_20;
  do {
    local_740 = local_740 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x299393);
  } while (local_740 != local_1b8);
  local_758 = (undefined1 **)&local_660;
  do {
    local_758 = local_758 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x2993e5);
  } while (local_758 != local_690);
  local_770 = (undefined1 **)&local_618;
  do {
    local_770 = local_770 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x299437);
  } while (local_770 != local_648);
  local_788 = (undefined1 **)&local_5d0;
  do {
    local_788 = local_788 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x299489);
  } while (local_788 != local_600);
  local_7a0 = (undefined1 **)&local_588;
  do {
    local_7a0 = local_7a0 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x2994db);
  } while (local_7a0 != local_5b8);
  local_7b8 = (undefined1 **)&local_540;
  do {
    local_7b8 = local_7b8 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x29952d);
  } while (local_7b8 != local_570);
  local_7d0 = (undefined1 **)&local_4f8;
  do {
    local_7d0 = local_7d0 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x29957f);
  } while (local_7d0 != local_528);
  local_7e8 = (undefined1 **)&local_4b0;
  do {
    local_7e8 = local_7e8 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x2995d1);
  } while (local_7e8 != local_4e0);
  local_800 = (undefined1 **)&local_468;
  do {
    local_800 = local_800 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x299623);
  } while (local_800 != local_498);
  local_818 = (undefined1 **)&local_420;
  do {
    local_818 = local_818 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x299675);
  } while (local_818 != local_450);
  local_830 = (undefined1 **)&local_3d8;
  do {
    local_830 = local_830 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x2996c7);
  } while (local_830 != local_408);
  local_848 = (undefined1 **)&local_390;
  do {
    local_848 = local_848 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x299719);
  } while (local_848 != local_3c0);
  local_860 = (undefined1 **)&local_348;
  do {
    local_860 = local_860 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x29976b);
  } while (local_860 != local_378);
  local_878 = (undefined1 **)&local_300;
  do {
    local_878 = local_878 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x2997bd);
  } while (local_878 != local_330);
  local_890 = (undefined1 **)&local_2b8;
  do {
    local_890 = local_890 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x29980f);
  } while (local_890 != local_2e8);
  local_8a8 = (undefined1 **)&local_270;
  do {
    local_8a8 = local_8a8 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x299861);
  } while (local_8a8 != local_2a0);
  local_8c0 = (undefined1 **)&local_228;
  do {
    local_8c0 = local_8c0 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x2998b3);
  } while (local_8c0 != local_258);
  local_8d8 = (undefined1 **)&local_1d0;
  do {
    local_8d8 = local_8d8 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x299905);
  } while (local_8d8 != local_200);
  jVar1.m_data.m_value.object = extraout_RDX.object;
  jVar1.m_data._0_8_ = in_RDI;
  return (json)jVar1.m_data;
}

Assistant:

virtual json to_json() override {
        return json {
            { "idle",                            n_idle_slots },
            { "processing",                      n_processing_slots },
            { "deferred",                        n_tasks_deferred },
            { "t_start",                         t_start },

            { "n_prompt_tokens_processed_total", n_prompt_tokens_processed_total },
            { "t_tokens_generation_total",       t_tokens_generation_total },
            { "n_tokens_predicted_total",        n_tokens_predicted_total },
            { "t_prompt_processing_total",       t_prompt_processing_total },

            { "n_prompt_tokens_processed",       n_prompt_tokens_processed },
            { "t_prompt_processing",             t_prompt_processing },
            { "n_tokens_predicted",              n_tokens_predicted },
            { "t_tokens_generation",             t_tokens_generation },

            { "n_decode_total",                  n_decode_total },
            { "n_busy_slots_total",              n_busy_slots_total },

            { "kv_cache_tokens_count",           kv_cache_tokens_count },
            { "kv_cache_used_cells",             kv_cache_used_cells },

            { "slots",                           slots_data },
        };
    }